

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapped_handler.hpp
# Opt level: O3

void __thiscall
asio::detail::
wrapped_handler<asio::io_context::strand,websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&,unsigned_long)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&,unsigned_long)>,std::error_code_const&,unsigned_long)>>,asio::detail::is_continuation_if_running>
::operator()(void *this,error_code *arg1,unsigned_long *arg2)

{
  tuple<std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  *this_00;
  binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>
  local_80;
  
  local_80.handler_.allocator_ = *(handler_allocator **)((long)this + 0x10);
  this_00 = &local_80.handler_.handler_._M_bound_args;
  local_80.handler_.handler_._M_f =
       *(offset_in_connection<websocketpp::config::asio::transport_config>_to_subr *)
        ((long)this + 0x18);
  local_80.handler_.handler_._8_8_ = *(undefined8 *)((long)this + 0x20);
  std::
  _Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  ::_Tuple_impl(&this_00->
                 super__Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                ,(_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                  *)((long)this + 0x28));
  local_80.arg1_._M_value = arg1->_M_value;
  local_80.arg1_._4_4_ = *(undefined4 *)&arg1->field_0x4;
  local_80.arg1_._M_cat = arg1->_M_cat;
  local_80.arg2_ = *arg2;
  strand_service::
  dispatch<asio::detail::binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&,unsigned_long)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&,unsigned_long)>,std::error_code_const&,unsigned_long)>>,std::error_code,unsigned_long>>
            (*this,(implementation_type *)((long)this + 8),&local_80);
  if (local_80.handler_.handler_._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .
      super__Head_base<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_false>
      ._M_head_impl.
      super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.handler_.handler_._M_bound_args.
               super__Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
               .
               super__Head_base<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_false>
               ._M_head_impl.
               super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_80.handler_.handler_._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .
      super__Tuple_impl<1UL,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .super__Head_base<1UL,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_false>.
      _M_head_impl.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_80.handler_.handler_._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .
      super__Tuple_impl<1UL,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .super__Head_base<1UL,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_false>.
      _M_head_impl.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  return;
}

Assistant:

void operator()(const Arg1& arg1, const Arg2& arg2)
  {
    dispatcher_.dispatch(detail::bind_handler(handler_, arg1, arg2));
  }